

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O2

char32_t __thiscall
pstore::utf::utf16_to_code_point<std::__cxx11::u16string,unsigned_short(*)(unsigned_short)>
          (utf *this,
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *src,
          _func_unsigned_short_unsigned_short *swapper)

{
  _func_unsigned_short_unsigned_short *in_RCX;
  pair<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char32_t>
  pVar1;
  
  pVar1 = utf16_to_code_point<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,unsigned_short(*)(unsigned_short)>
                    (*(utf **)this,
                     (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                      )(*(utf **)this + *(long *)(this + 8) * 2),
                     (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                      )src,in_RCX);
  if (pVar1.first._M_current._M_current == (char16_t *)(*(long *)(this + 8) * 2 + *(long *)this)) {
    return pVar1.second;
  }
  assert_failed("end == std::end (src)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/utf.hpp"
                ,0x10f);
}

Assistant:

auto utf16_to_code_point (InputType const & src, Swapper swapper) -> char32_t {
            auto end = std::end (src);
            char32_t cp;
            std::tie (end, cp) = utf16_to_code_point (std::begin (src), end, swapper);
            PSTORE_ASSERT (end == std::end (src));
            return cp;
        }